

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Printer::CopyToBuffer(Printer *this,char *data,int size)

{
  byte bVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  void *void_buffer;
  undefined8 local_20;
  int local_14;
  void *local_10;
  
  if (((*(byte *)(in_RDI + 0x49) & 1) == 0) && (local_14 = in_EDX, local_10 = in_RSI, in_EDX != 0))
  {
    while (*(int *)(in_RDI + 0x18) < local_14) {
      if (0 < *(int *)(in_RDI + 0x18)) {
        memcpy(*(void **)(in_RDI + 0x10),local_10,(long)*(int *)(in_RDI + 0x18));
        *(long *)(in_RDI + 0x20) = (long)*(int *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20);
        local_10 = (void *)((long)local_10 + (long)*(int *)(in_RDI + 0x18));
        local_14 = local_14 - *(int *)(in_RDI + 0x18);
      }
      bVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                        (*(long **)(in_RDI + 8),&local_20,in_RDI + 0x18);
      *(byte *)(in_RDI + 0x49) = (bVar1 ^ 0xff) & 1;
      if ((*(byte *)(in_RDI + 0x49) & 1) != 0) {
        return;
      }
      *(undefined8 *)(in_RDI + 0x10) = local_20;
    }
    memcpy(*(void **)(in_RDI + 0x10),local_10,(long)local_14);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (long)local_14;
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) - local_14;
    *(long *)(in_RDI + 0x20) = (long)local_14 + *(long *)(in_RDI + 0x20);
  }
  return;
}

Assistant:

void Printer::CopyToBuffer(const char* data, int size) {
  if (failed_) return;
  if (size == 0) return;

  while (size > buffer_size_) {
    // Data exceeds space in the buffer.  Copy what we can and request a
    // new buffer.
    if (buffer_size_ > 0) {
      memcpy(buffer_, data, buffer_size_);
      offset_ += buffer_size_;
      data += buffer_size_;
      size -= buffer_size_;
    }
    void* void_buffer;
    failed_ = !output_->Next(&void_buffer, &buffer_size_);
    if (failed_) return;
    buffer_ = reinterpret_cast<char*>(void_buffer);
  }

  // Buffer is big enough to receive the data; copy it.
  memcpy(buffer_, data, size);
  buffer_ += size;
  buffer_size_ -= size;
  offset_ += size;
}